

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O0

void __thiscall gmlc::networking::TcpConnection::waitOnClose(TcpConnection *this)

{
  bool bVar1;
  ConnectionStates CVar2;
  int iVar3;
  ostream *poVar4;
  element_type *peVar5;
  TcpConnection *in_RDI;
  stringstream str;
  string *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdbc;
  TcpConnection *in_stack_fffffffffffffdc0;
  TriggerVariable *in_stack_fffffffffffffdd0;
  undefined7 in_stack_fffffffffffffde0;
  byte in_stack_fffffffffffffde7;
  TriggerVariable *in_stack_fffffffffffffde8;
  long local_1a0 [2];
  ostream local_190 [380];
  int local_14;
  duration<long,std::ratio<1l,1000l>> local_10 [16];
  
  iVar3 = 2;
  bVar1 = CLI::std::atomic<bool>::load
                    ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                     (memory_order)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
  if (bVar1) {
    if ((in_RDI->connecting & 1U) != 0) {
      concurrency::TriggerVariable::waitActivation(in_stack_fffffffffffffdd0);
    }
    while( true ) {
      local_14 = 200;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_10,&local_14);
      bVar1 = concurrency::TriggerVariable::wait_for
                        (in_stack_fffffffffffffde8,
                         (milliseconds *)
                         CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      std::__cxx11::stringstream::stringstream((stringstream *)local_1a0);
      poVar4 = std::operator<<(local_190,"wait timeout ");
      CVar2 = std::atomic<gmlc::networking::TcpConnection::ConnectionStates>::load
                        (&in_RDI->state,seq_cst);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,CVar2);
      in_stack_fffffffffffffde8 = (TriggerVariable *)std::operator<<(poVar4," ");
      peVar5 = std::
               __shared_ptr_access<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x7d1513);
      iVar3 = (*peVar5->_vptr_Socket[8])();
      in_stack_fffffffffffffde7 = (byte)iVar3;
      poVar4 = (ostream *)
               std::ostream::operator<<
                         (in_stack_fffffffffffffde8,(bool)(in_stack_fffffffffffffde7 & 1));
      poVar4 = std::operator<<(poVar4," ");
      bVar1 = concurrency::TriggerVariable::isTriggered((TriggerVariable *)0x7d1566);
      std::ostream::operator<<(poVar4,bVar1);
      std::__cxx11::stringstream::str();
      logger(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffdb0);
      std::ios::clear((int)local_1a0 + (int)*(undefined8 *)(local_1a0[0] + -0x18));
      in_stack_fffffffffffffdc0 = (TcpConnection *)std::operator<<(local_190,"wait info ");
      bVar1 = ::asio::io_context::stopped((io_context *)0x7d1605);
      in_stack_fffffffffffffdbc = CONCAT13(bVar1,(int3)in_stack_fffffffffffffdbc);
      in_stack_fffffffffffffdb0 =
           (string *)std::ostream::operator<<(in_stack_fffffffffffffdc0,bVar1);
      poVar4 = std::operator<<((ostream *)in_stack_fffffffffffffdb0," ");
      std::ostream::operator<<(poVar4,(bool)(in_RDI->connecting & 1));
      std::__cxx11::stringstream::str();
      logger(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffdb0);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    }
  }
  else {
    close(in_RDI,iVar3);
  }
  std::atomic<gmlc::networking::TcpConnection::ConnectionStates>::store
            (&in_RDI->state,CLOSED,seq_cst);
  return;
}

Assistant:

void TcpConnection::waitOnClose()
{
    if (triggerhalt.load(std::memory_order_acquire)) {
        if (connecting) {
            connected.waitActivation();
        }

        while (!receivingHalt.wait_for(std::chrono::milliseconds(200))) {
            std::stringstream str;
            str << "wait timeout " << static_cast<int>(state.load()) << " "
                << socket_->is_open() << " " << receivingHalt.isTriggered();
            logger(1, str.str());
            str.clear();

            str << "wait info " << context_.stopped() << " " << connecting;
            logger(1, str.str());
        }
    } else {
        close();
    }
    state.store(ConnectionStates::CLOSED);
}